

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O3

bool cmFortranParser_FilePush(cmFortranParser *parser,char *fname)

{
  FILE *pFVar1;
  YY_BUFFER_STATE_conflict1 pyVar2;
  cmFortranFile f;
  string dir;
  allocator local_79;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  
  std::__cxx11::string::string((string *)local_78,fname,(allocator *)&local_48);
  pFVar1 = cmsys::SystemTools::Fopen((string *)local_78,"rb");
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
  }
  if (pFVar1 != (FILE *)0x0) {
    pyVar2 = cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::__cxx11::string::string((string *)local_78,fname,&local_79);
    cmsys::SystemTools::GetParentDirectory(&local_48,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
    }
    local_78._0_8_ = pFVar1;
    local_78._8_8_ = pyVar2;
    local_68._M_allocated_capacity = (size_type)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 0x10),local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    pyVar2 = cmFortran_yy_create_buffer((FILE *)0x0,0x4000,parser->Scanner);
    cmFortran_yy_switch_to_buffer(pyVar2,parser->Scanner);
    std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>::push_back
              (&(parser->FileStack).c,(value_type *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity != &local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool cmFortranParser_FilePush(cmFortranParser* parser,
                                    const char* fname)
{
  // Open the new file and push it onto the stack.  Save the old
  // buffer with it on the stack.
  if(FILE* file = cmsys::SystemTools::Fopen(fname, "rb"))
    {
    YY_BUFFER_STATE current =
      cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    std::string dir = cmSystemTools::GetParentDirectory(fname);
    cmFortranFile f(file, current, dir);
    YY_BUFFER_STATE buffer =
      cmFortran_yy_create_buffer(0, 16384, parser->Scanner);
    cmFortran_yy_switch_to_buffer(buffer, parser->Scanner);
    parser->FileStack.push(f);
    return 1;
    }
  else
    {
    return 0;
    }
}